

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::DeviceContextBase
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          DeviceImplType *pRenderDevice,DeviceContextDesc *Desc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  byte bVar3;
  Bool BVar4;
  COMMAND_QUEUE_TYPE CVar5;
  char *__s;
  Uint8 UVar6;
  Uint8 UVar7;
  size_t sVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  char (*Args_1) [21];
  char cVar12;
  ulong uVar13;
  long lVar14;
  string msg;
  string __str;
  string local_a8;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  RefCntAutoPtr<Diligent::BufferGLImpl> *local_48;
  RefCntAutoPtr<Diligent::PipelineStateGLImpl> *local_40;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl> *local_38;
  
  RefCountedObject<Diligent::IDeviceContextGL>::RefCountedObject<>
            ((RefCountedObject<Diligent::IDeviceContextGL> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IDeviceContextGL>).
  super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.super_IDeviceContext.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_0041ff20;
  local_38 = &this->m_pDevice;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::RefCntAutoPtr(local_38,pRenderDevice);
  lVar14 = 0;
  memset(this->m_VertexStreams,0,0x200);
  this->m_NumVertexStreams = 0;
  local_40 = &this->m_pPipelineState;
  local_48 = &this->m_pIndexBuffer;
  (this->m_pPipelineState).m_pObject = (PipelineStateGLImpl *)0x0;
  (this->m_pIndexBuffer).m_pObject = (BufferGLImpl *)0x0;
  *(undefined8 *)((long)&(this->m_pIndexBuffer).m_pObject + 4) = 0;
  *(undefined8 *)((long)&this->m_IndexDataStartOffset + 4) = 0;
  this->m_BlendFactors[0] = -1.0;
  this->m_BlendFactors[1] = -1.0;
  this->m_BlendFactors[2] = -1.0;
  this->m_BlendFactors[3] = -1.0;
  do {
    puVar9 = (undefined8 *)((long)&this->m_Viewports[0].TopLeftX + lVar14);
    *puVar9 = 0;
    puVar9[1] = 0;
    *(undefined8 *)((long)&this->m_Viewports[0].MinDepth + lVar14) = 0x3f80000000000000;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x180);
  memset(&this->m_NumViewports,0,0x104);
  this->m_NumScissorRects = 0;
  this->m_pBoundRenderTargets[0].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[1].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[2].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[3].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[4].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[5].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[6].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_pBoundRenderTargets[7].m_pObject = (TextureViewGLImpl *)0x0;
  this->m_NumBoundRenderTargets = 0;
  this->m_FramebufferWidth = 0;
  this->m_FramebufferHeight = 0;
  this->m_FramebufferSlices = 0;
  this->m_FramebufferSamples = 0;
  (this->m_pBoundDepthStencil).m_pObject = (TextureViewGLImpl *)0x0;
  (this->m_pBoundFramebuffer).m_pObject = (FramebufferGLImpl *)0x0;
  (this->m_pActiveRenderPass).m_pObject = (RenderPassGLImpl *)0x0;
  (this->m_pBoundShadingRateMap).m_pObject = (ITextureView *)0x0;
  *(undefined8 *)((long)&(this->m_pBoundShadingRateMap).m_pObject + 5) = 0;
  this->m_FrameNumber = 0;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  __s = Desc->Name;
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_Name,__s,__s + sVar8);
    goto LAB_00135ded;
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Context #","");
  bVar3 = Desc->ContextId;
  cVar12 = '\x01';
  if (9 < bVar3) {
    cVar12 = '\x03' - (bVar3 < 100);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,local_80,(uint)bVar3);
  uVar2 = CONCAT44(uStack_7c,local_80) + local_60;
  uVar13 = 0xf;
  if (local_68 != local_58) {
    uVar13 = local_58[0];
  }
  if (uVar13 < uVar2) {
    uVar13 = 0xf;
    if (local_88 != local_78) {
      uVar13 = local_78[0];
    }
    if (uVar13 < uVar2) goto LAB_00135cd6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
  }
  else {
LAB_00135cd6:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8.field_2._8_8_ = puVar9[3];
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar11;
    local_a8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_a8._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a8);
  paVar1 = &(this->m_Name).field_2;
  (this->m_Name)._M_dataplus._M_p = (pointer)paVar1;
  psVar11 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar11) {
    lVar14 = plVar10[3];
    paVar1->_M_allocated_capacity = *psVar11;
    *(long *)((long)&(this->m_Name).field_2 + 8) = lVar14;
  }
  else {
    (this->m_Name)._M_dataplus._M_p = (pointer)*plVar10;
    paVar1->_M_allocated_capacity = *psVar11;
  }
  (this->m_Name)._M_string_length = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
LAB_00135ded:
  Args_1 = (char (*) [21])(this->m_Name)._M_dataplus._M_p;
  BVar4 = Desc->IsDeferred;
  CVar5 = COMMAND_QUEUE_TYPE_UNKNOWN;
  if (BVar4 == false) {
    CVar5 = Desc->QueueType;
  }
  UVar6 = Desc->ContextId;
  UVar7 = Desc->QueueId;
  (this->m_Desc).Name = (Char *)Args_1;
  (this->m_Desc).QueueType = CVar5;
  (this->m_Desc).IsDeferred = BVar4;
  (this->m_Desc).ContextId = UVar6;
  (this->m_Desc).QueueId = UVar7;
  (this->m_Desc).TextureCopyGranularity[0] = 0;
  (this->m_Desc).TextureCopyGranularity[1] = 0;
  (this->m_Desc).TextureCopyGranularity[2] = 0;
  if (BVar4 == false) {
    (this->m_Desc).TextureCopyGranularity[0] = 1;
    (this->m_Desc).TextureCopyGranularity[1] = 1;
    (this->m_Desc).TextureCopyGranularity[2] = 1;
  }
  this->m_NativeMultiDrawSupported =
       (pRenderDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features.
       NativeMultiDraw != DEVICE_FEATURE_STATE_DISABLED;
  (this->m_DstImmediateContextId).m_Value = 0xff;
  memset(&this->m_Stats,0,0x164);
  (this->m_DbgMappedBuffers)._M_h._M_buckets = &(this->m_DbgMappedBuffers)._M_h._M_single_bucket;
  (this->m_DbgMappedBuffers)._M_h._M_bucket_count = 1;
  (this->m_DbgMappedBuffers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_DbgMappedBuffers)._M_h._M_element_count = 0;
  (this->m_DbgMappedBuffers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->m_DvpRenderTargetFormatsHash = 0;
  (this->m_DbgMappedBuffers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_DbgMappedBuffers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->m_DvpDebugGroupCount = 0;
  if ((this->m_pDevice).m_pObject == (RenderDeviceGLImpl *)0x0) {
    FormatString<char[26],char[21]>
              (&local_a8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pDevice != nullptr",Args_1);
    DebugAssertionFailed
              (local_a8._M_dataplus._M_p,"DeviceContextBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

DeviceContextBase(IReferenceCounters*      pRefCounters,
                      DeviceImplType*          pRenderDevice,
                      const DeviceContextDesc& Desc) :
        // clang-format off
        TObjectBase{pRefCounters },
        m_pDevice  {pRenderDevice},
        m_Name
        {
            Desc.Name != nullptr && *Desc.Name != '\0' ?
                String{Desc.Name} :
                String{"Context #"} + std::to_string(Uint32{Desc.ContextId}) + (Desc.IsDeferred ? " (deferred)" : " (immediate)")
        },
        m_Desc
        {
            m_Name.c_str(),
            Desc.IsDeferred ? COMMAND_QUEUE_TYPE_UNKNOWN : Desc.QueueType,
            Desc.IsDeferred,
            Desc.ContextId,
            Desc.QueueId
        },
        m_NativeMultiDrawSupported{pRenderDevice->GetDeviceInfo().Features.NativeMultiDraw != DEVICE_FEATURE_STATE_DISABLED}
    // clang-format on
    {
        VERIFY_EXPR(m_pDevice != nullptr);
    }